

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool rm(upb_table *t,lookupkey_t key,upb_value *val,upb_tabkey *removed,uint32_t hash,
        eqlfunc_t *eql)

{
  _upb_tabent *p_Var1;
  _Bool _Var2;
  byte local_59;
  upb_tabent *rm;
  upb_tabent *move;
  upb_tabent *chain;
  uint32_t hash_local;
  upb_tabkey *removed_local;
  upb_value *val_local;
  upb_table *t_local;
  lookupkey_t key_local;
  
  move = getentry_mutable(t,hash);
  _Var2 = upb_tabent_isempty(move);
  if (_Var2) {
    key_local.str.len._7_1_ = 0;
  }
  else {
    _Var2 = (*eql)(move->key,key);
    if (_Var2) {
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        _upb_value_setval(val,(move->val).val);
      }
      if (removed != (upb_tabkey *)0x0) {
        *removed = move->key;
      }
      if (move->next == (_upb_tabent *)0x0) {
        move->key = 0;
      }
      else {
        p_Var1 = move->next;
        move->key = p_Var1->key;
        (move->val).val = (p_Var1->val).val;
        move->next = p_Var1->next;
        p_Var1->key = 0;
      }
      key_local.str.len._7_1_ = 1;
    }
    else {
      while( true ) {
        local_59 = 0;
        if (move->next != (_upb_tabent *)0x0) {
          _Var2 = (*eql)(move->next->key,key);
          local_59 = _Var2 ^ 0xff;
        }
        if ((local_59 & 1) == 0) break;
        move = move->next;
      }
      if (move->next == (_upb_tabent *)0x0) {
        key_local.str.len._7_1_ = 0;
      }
      else {
        p_Var1 = move->next;
        t->count = t->count - 1;
        if (val != (upb_value *)0x0) {
          _upb_value_setval(val,(move->next->val).val);
        }
        if (removed != (upb_tabkey *)0x0) {
          *removed = p_Var1->key;
        }
        p_Var1->key = 0;
        move->next = p_Var1->next;
        key_local.str.len._7_1_ = 1;
      }
    }
  }
  return (_Bool)key_local.str.len._7_1_;
}

Assistant:

static bool rm(upb_table* t, lookupkey_t key, upb_value* val,
               upb_tabkey* removed, uint32_t hash, eqlfunc_t* eql) {
  upb_tabent* chain = getentry_mutable(t, hash);
  if (upb_tabent_isempty(chain)) return false;
  if (eql(chain->key, key)) {
    /* Element to remove is at the head of its chain. */
    t->count--;
    if (val) _upb_value_setval(val, chain->val.val);
    if (removed) *removed = chain->key;
    if (chain->next) {
      upb_tabent* move = (upb_tabent*)chain->next;
      *chain = *move;
      move->key = 0; /* Make the slot empty. */
    } else {
      chain->key = 0; /* Make the slot empty. */
    }
    return true;
  } else {
    /* Element to remove is either in a non-head position or not in the
     * table. */
    while (chain->next && !eql(chain->next->key, key)) {
      chain = (upb_tabent*)chain->next;
    }
    if (chain->next) {
      /* Found element to remove. */
      upb_tabent* rm = (upb_tabent*)chain->next;
      t->count--;
      if (val) _upb_value_setval(val, chain->next->val.val);
      if (removed) *removed = rm->key;
      rm->key = 0; /* Make the slot empty. */
      chain->next = rm->next;
      return true;
    } else {
      /* Element to remove is not in the table. */
      return false;
    }
  }
}